

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProgressBar.cpp
# Opt level: O0

void __thiscall OpenMD::ProgressBar::update(ProgressBar *this)

{
  int iVar1;
  char *pcVar2;
  double *pdVar3;
  void *this_00;
  double *in_RDI;
  char buffer [22];
  tm *ender;
  time_t end_;
  time_t current_;
  int hashes;
  RealType percent;
  int avail;
  winsize w;
  int width;
  char local_78 [32];
  tm *local_58;
  long local_50;
  time_t local_48;
  int local_3c;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  int local_18;
  undefined1 local_14 [2];
  ushort local_12;
  uint local_c;
  
  iVar1 = fileno(_stdout);
  iVar1 = isatty(iVar1);
  if (iVar1 != 0) {
    pcVar2 = getenv("SGE_TASK_ID");
    if (pcVar2 == (char *)0x0) {
      local_c = 0;
      iVar1 = fileno(_stdout);
      ioctl(iVar1,0x5413,local_14);
      local_c = (uint)local_12;
      if (local_c == 0) {
        local_c = 0x50;
      }
      local_18 = local_c - 0x27;
      *(int *)(in_RDI + 2) = *(int *)(in_RDI + 2) + 1;
      if (0.0 < in_RDI[1]) {
        local_28 = (*in_RDI * 100.0) / in_RDI[1];
        local_30 = 1e-06;
        pdVar3 = std::max<double>(&local_28,&local_30);
        local_38 = 100.0;
        pdVar3 = std::min<double>(pdVar3,&local_38);
        local_20 = *pdVar3;
        local_3c = (int)((local_20 * (double)local_18) / 100.0);
        local_48 = time((time_t *)0x0);
        local_50 = (long)((double)(local_48 - (long)in_RDI[3]) * (100.0 / local_20) +
                         (double)(long)in_RDI[3]);
        local_58 = localtime(&local_50);
        strftime(local_78,0x16,"%a %b %d @ %I:%M %p",local_58);
        std::operator<<((ostream *)&std::cout,'\r');
        std::ios_base::width((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),3);
        this_00 = (void *)std::ostream::operator<<(&std::cout,std::right);
        std::ostream::operator<<(this_00,(int)local_20);
        std::ios_base::width((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),3);
        std::operator<<((ostream *)&std::cout,"% [");
        std::ios::fill((char)*(undefined8 *)(std::cout + -0x18) + '`');
        if (local_3c + 1 < local_18) {
          std::ios_base::width
                    ((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),
                     (long)(local_3c + 1));
          std::operator<<((ostream *)&std::cout,progressSpinner_[(int)(*(uint *)(in_RDI + 2) & 3)]);
        }
        else {
          std::ios_base::width
                    ((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),(long)local_18);
          std::operator<<((ostream *)&std::cout,'#');
        }
        std::ios::fill((char)*(undefined8 *)(std::cout + -0x18) + '`');
        if (0 < (local_18 - local_3c) + -1) {
          std::ios_base::width
                    ((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),
                     (long)((local_18 - local_3c) + -1));
          std::operator<<((ostream *)&std::cout,' ');
        }
        std::ios_base::width((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),0xb);
        std::operator<<((ostream *)&std::cout,"] Estimate:");
        std::ios_base::width((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),0x16);
        std::operator<<((ostream *)&std::cout,local_78);
      }
      std::ostream::flush();
    }
  }
  return;
}

Assistant:

void ProgressBar::update() {
#ifdef IS_MPI
    int myRank;
    MPI_Comm_rank(MPI_COMM_WORLD, &myRank);
    if (myRank == 0) {
#endif

      // only do the progress bar if we are actually running in a tty:
      if (isatty(fileno(stdout)) && (getenv("SGE_TASK_ID") == NULL)) {
        // get the window width:

        int width = 0;
#ifdef _MSC_VER
        CONSOLE_SCREEN_BUFFER_INFO csbi;
        HANDLE hConsole = GetStdHandle(STD_OUTPUT_HANDLE);
        int ret         = GetConsoleScreenBufferInfo(hConsole, &csbi);
        if (ret) { width = csbi.dwSize.X - 1; }
#else
      struct winsize w;
      ioctl(fileno(stdout), TIOCGWINSZ, &w);
      width = w.ws_col;
#endif

        // handle the case when the width is returned as a nonsensical value.
        if (width <= 0) width = 80;

        // We'll use:
        // 31 characters for the completion estimate,
        //  6 for the % complete,
        //  2 characters for the open and closing brackets.

        int avail = width - 31 - 6 - 2;

        ++iteration_;

        if (maximum_ > 0.0) {
          // we know the maximum, so draw a progress bar

          RealType percent =
              std::min(std::max(value_ * 100.0 / maximum_, 1e-6), 100.0);

          int hashes = int(percent * avail / 100.0);

          // compute the best estimate of the ending time:
          time_t current_  = time(NULL);
          time_t end_      = static_cast<time_t>(start_ + (current_ - start_) *
                                                         (100.0 / percent));
          struct tm* ender = localtime(&end_);
          char buffer[22];
          strftime(buffer, 22, "%a %b %d @ %I:%M %p", ender);

#ifdef _MSC_VER
          csbi.dwCursorPosition.X = 0;
          SetConsoleCursorPosition(hConsole, csbi.dwCursorPosition);
#else
        cout << '\r';
#endif
          cout.width(3);
          cout << right << int(percent);
          cout.width(3);
          cout << "% [";
          cout.fill('#');
          if (hashes + 1 < avail) {
            cout.width(hashes + 1);
            cout << progressSpinner_[iteration_ & 3];
          } else {
            cout.width(avail);
            cout << '#';
          }
          cout.fill(' ');
          if (avail - hashes - 1 > 0) {
            cout.width(avail - hashes - 1);
            cout << ' ';
          }
          cout.width(11);
          cout << "] Estimate:";
          cout.width(22);
          cout << buffer;
        }
        cout.flush();
      }
#ifdef IS_MPI
    }
#endif
  }

  void ProgressBar::setStatus(RealType val, RealType max) {
    value_   = val;
    maximum_ = max;
  }
}